

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * getmempoolancestors(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff398;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff3a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b0;
  RPCResults *in_stack_fffffffffffff3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d0;
  UniValue *in_stack_fffffffffffff3d8;
  iterator in_stack_fffffffffffff3e0;
  RPCArgOptions *in_stack_fffffffffffff3e8;
  string *in_stack_fffffffffffff3f0;
  undefined7 in_stack_fffffffffffff3f8;
  undefined1 in_stack_fffffffffffff3ff;
  undefined4 in_stack_fffffffffffff400;
  Type in_stack_fffffffffffff404;
  string *in_stack_fffffffffffff408;
  undefined4 in_stack_fffffffffffff410;
  Type in_stack_fffffffffffff414;
  undefined4 in_stack_fffffffffffff418;
  Type in_stack_fffffffffffff41c;
  RPCResult *in_stack_fffffffffffff420;
  RPCMethodImpl *local_ba0;
  undefined1 *local_b88;
  undefined1 *local_b70;
  undefined1 *local_b58;
  RPCExamples *examples;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_9d0 [36];
  allocator<char> local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa [32];
  undefined1 local_98a;
  RPCResults local_989;
  undefined1 local_96c;
  undefined1 local_96b;
  undefined1 local_96a [33];
  allocator<char> local_949 [30];
  allocator<char> local_92b;
  allocator<char> local_92a;
  allocator<char> local_929 [29];
  allocator<char> local_90c [2];
  allocator<char> local_90a;
  allocator<char> local_909;
  undefined4 local_908;
  allocator<char> local_901 [31];
  allocator<char> local_8e2;
  allocator<char> local_8e1 [321];
  undefined1 local_7a0 [136];
  undefined1 local_718 [160];
  undefined1 local_678 [136];
  undefined1 local_5f0 [96];
  undefined1 local_590 [136];
  string local_508 [4];
  undefined1 local_480 [40];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  RPCMethodImpl local_258 [16];
  RPCMethodImpl local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_908 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3a8,&in_stack_fffffffffffff3a0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3b0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff398);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 in_stack_fffffffffffff408,in_stack_fffffffffffff404,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_90c[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff3d8,(bool *)in_stack_fffffffffffff3d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_480[0] = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3b0);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff398);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 in_stack_fffffffffffff408,in_stack_fffffffffffff404,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8),
                 in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  fun = local_258;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff398);
  __l._M_len = (size_type)in_stack_fffffffffffff3e8;
  __l._M_array = in_stack_fffffffffffff3e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3d8,__l,
             (allocator_type *)in_stack_fffffffffffff3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  local_96a._2_8_ = 0;
  local_96a._10_8_ = 0;
  local_96a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff398);
  RPCResult::RPCResult
            (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
             (string *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
             in_stack_fffffffffffff408,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
             (bool)in_stack_fffffffffffff3ff);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff398);
  __l_00._M_len = (size_type)in_stack_fffffffffffff3e8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff3e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff3d0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff420,
             (string *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             in_stack_fffffffffffff414,in_stack_fffffffffffff408,
             (string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8));
  name = local_508;
  this_00 = (RPCHelpMan *)local_96a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  description = (string *)&local_96b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_96c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  results_00 = &local_989;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  examples = (RPCExamples *)&local_98a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  MempoolEntryDescription();
  RPCResult::RPCResult
            (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
             (string *)CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
             in_stack_fffffffffffff408,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
             (bool)in_stack_fffffffffffff3ff);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff398);
  __l_01._M_len = (size_type)in_stack_fffffffffffff3e8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff3e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3d8,__l_01,
             (allocator_type *)in_stack_fffffffffffff3d0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff420,
             (string *)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
             in_stack_fffffffffffff414,in_stack_fffffffffffff408,
             (string *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff3ff,in_stack_fffffffffffff3f8));
  results._M_len = (size_type)in_stack_fffffffffffff3e8;
  results._M_array = (iterator)in_stack_fffffffffffff3e0;
  RPCResults::RPCResults(in_stack_fffffffffffff3c0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleCli(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e8,(char *)in_stack_fffffffffffff3e0,
             (allocator<char> *)in_stack_fffffffffffff3d8);
  HelpExampleRpc(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  std::operator+(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff398,(string *)0x12f4de5);
  this = (RPCArg *)local_9d0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getmempoolancestors()::__0,void>
            (in_stack_fffffffffffff3a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff3a0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results_00,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_9d0 + 0x23));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ac);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ab);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9aa);
  RPCResults::~RPCResults((RPCResults *)this);
  local_b58 = local_480;
  do {
    local_b58 = local_b58 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_b58 != local_590);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_b70 = local_718;
  do {
    local_b70 = local_b70 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_b70 != local_7a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_98a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_96c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_96b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_96a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_b88 = local_5f0;
  do {
    local_b88 = local_b88 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_b88 != local_678);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_96a + 0x20));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_949);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_92b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_92a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_929);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_ba0 = local_48;
  do {
    local_ba0 = (RPCMethodImpl *)&local_ba0[-9]._M_invoker;
    RPCArg::~RPCArg(this);
  } while (local_ba0 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_90c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_90a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_909);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_901);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_8e2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_8e1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmempoolancestors()
{
    return RPCHelpMan{"getmempoolancestors",
        "\nIf txid is in the mempool, returns all in-mempool ancestors.\n",
        {
            {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id (must be in mempool)"},
            {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "True for a json object, false for array of transaction ids"},
        },
        {
            RPCResult{"for verbose = false",
                RPCResult::Type::ARR, "", "",
                {{RPCResult::Type::STR_HEX, "", "The transaction id of an in-mempool ancestor transaction"}}},
            RPCResult{"for verbose = true",
                RPCResult::Type::OBJ_DYN, "", "",
                {
                    {RPCResult::Type::OBJ, "transactionid", "", MempoolEntryDescription()},
                }},
        },
        RPCExamples{
            HelpExampleCli("getmempoolancestors", "\"mytxid\"")
            + HelpExampleRpc("getmempoolancestors", "\"mytxid\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    bool fVerbose = false;
    if (!request.params[1].isNull())
        fVerbose = request.params[1].get_bool();

    uint256 hash = ParseHashV(request.params[0], "parameter 1");

    const CTxMemPool& mempool = EnsureAnyMemPool(request.context);
    LOCK(mempool.cs);

    const auto entry{mempool.GetEntry(Txid::FromUint256(hash))};
    if (entry == nullptr) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Transaction not in mempool");
    }

    auto ancestors{mempool.AssumeCalculateMemPoolAncestors(self.m_name, *entry, CTxMemPool::Limits::NoLimits(), /*fSearchForParents=*/false)};

    if (!fVerbose) {
        UniValue o(UniValue::VARR);
        for (CTxMemPool::txiter ancestorIt : ancestors) {
            o.push_back(ancestorIt->GetTx().GetHash().ToString());
        }
        return o;
    } else {
        UniValue o(UniValue::VOBJ);
        for (CTxMemPool::txiter ancestorIt : ancestors) {
            const CTxMemPoolEntry &e = *ancestorIt;
            const uint256& _hash = e.GetTx().GetHash();
            UniValue info(UniValue::VOBJ);
            entryToJSON(mempool, info, e);
            o.pushKV(_hash.ToString(), std::move(info));
        }
        return o;
    }
},
    };
}